

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ObjectBegin(ParsedScene *this,string *name,FileLoc loc)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
  *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  char *fmt;
  undefined1 local_88 [72];
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [16];
  
  if (this->currentApiState == OptionsBlock) {
    fmt = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::
      vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>::
      push_back(&this->pushedGraphicsStates,this->graphicsState);
      std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::push_back
                (&this->pushedTransforms,&this->curTransform);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->pushedActiveTransformBits,&this->activeTransformBits);
      local_88[0] = (string)0x6f;
      local_88._24_4_ = loc.line;
      local_88._28_4_ = loc.column;
      local_88._8_8_ = loc.filename._M_len;
      local_88._16_8_ = loc.filename._M_str;
      std::vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>::
      emplace_back<std::pair<char,pbrt::FileLoc>>
                ((vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>
                  *)&this->pushStack,(pair<char,_pbrt::FileLoc> *)local_88);
      if (this->currentInstance != (InstanceDefinitionSceneEntity *)0x0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"ObjectBegin called inside of instance definition");
        return;
      }
      this_00 = &this->instanceDefinitions;
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
              ::find(&this_00->_M_t,name);
      uVar1 = loc._16_8_;
      local_88._40_8_ = loc.filename._M_str;
      local_88._32_8_ = loc.filename._M_len;
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header) {
        (this->super_SceneRepresentation).errorExit = true;
        Error<std::__cxx11::string_const&>(&loc,"%s: trying to redefine an object instance",name);
        return;
      }
      std::__cxx11::string::string((string *)local_88,(string *)name);
      uVar2 = loc._16_8_;
      loc.line = (int)uVar1;
      loc.column = SUB84(uVar1,4);
      local_88._48_4_ = loc.line;
      local_88._52_4_ = loc.column;
      local_88._56_16_ = SUB3216(ZEXT832(0),0) << 0x20;
      auStack_30 = (undefined1  [16])0x0;
      loc._16_8_ = uVar2;
      auStack_40 = local_88._56_16_;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
               ::operator[](this_00,name);
      InstanceDefinitionSceneEntity::operator=(pmVar4,(InstanceDefinitionSceneEntity *)local_88);
      InstanceDefinitionSceneEntity::~InstanceDefinitionSceneEntity
                ((InstanceDefinitionSceneEntity *)local_88);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
               ::operator[](this_00,name);
      this->currentInstance = pmVar4;
      return;
    }
    fmt = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[12]>(&loc,fmt,(char (*) [12])"ObjectBegin");
  return;
}

Assistant:

void ParsedScene::ObjectBegin(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectBegin");
    pushedGraphicsStates.push_back(*graphicsState);
    pushedTransforms.push_back(curTransform);
    pushedActiveTransformBits.push_back(activeTransformBits);

    pushStack.push_back(std::make_pair('o', loc));

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc, "ObjectBegin called inside of instance definition");
        return;
    }

    if (instanceDefinitions.find(name) != instanceDefinitions.end()) {
        ErrorExitDeferred(&loc, "%s: trying to redefine an object instance", name);
        return;
    }

    instanceDefinitions[name] = InstanceDefinitionSceneEntity(name, loc);
    // This should be safe since we're not adding anything to
    // instanceDefinitions until after ObjectEnd... (Still makes me
    // nervous.)
    currentInstance = &instanceDefinitions[name];
}